

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_SetModuleExportList(JSContext *ctx,JSModuleDef *m,JSCFunctionListEntry *tab,int len)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  JSValueUnion JVar4;
  long lVar5;
  bool bVar6;
  JSValue obj;
  
  uVar3 = (ulong)(uint)len;
  if (len < 1) {
    uVar3 = 0;
  }
  lVar5 = 0;
  do {
    if (uVar3 * 0x20 + 0x20 == lVar5 + 0x20) {
      return 0;
    }
    switch((&tab->def_type)[lVar5]) {
    case '\0':
      obj = JS_NewCFunction2(ctx,*(JSCFunction **)((long)&tab->u + lVar5 + 8),
                             *(char **)((long)&tab->name + lVar5),
                             (uint)*(byte *)((long)&tab->u + lVar5),
                             (uint)*(byte *)((long)&tab->u + lVar5 + 1),
                             (int)*(short *)((long)&tab->magic + lVar5));
      break;
    default:
      abort();
    case '\x03':
      obj = JS_NewString(ctx,*(char **)((long)&tab->u + lVar5));
      break;
    case '\x04':
      obj = (JSValue)ZEXT416(*(uint *)((long)&tab->u + lVar5));
      break;
    case '\x05':
      uVar1 = *(ulong *)((long)&tab->u + lVar5);
      bVar6 = (long)(int)uVar1 == uVar1;
      JVar4.float64 = (double)(long)uVar1;
      if (bVar6) {
        JVar4.ptr = (void *)(uVar1 & 0xffffffff);
      }
      obj.tag = 7;
      obj.u.float64 = JVar4.float64;
      if (bVar6) {
        obj.tag = 0;
      }
      break;
    case '\x06':
      obj.tag = 7;
      obj.u.ptr = ((JSValueUnion *)((long)&tab->u + lVar5))->ptr;
      break;
    case '\b':
      obj = JS_NewObject(ctx);
      JS_SetPropertyFunctionList
                (ctx,obj,*(JSCFunctionListEntry **)((long)&tab->u + lVar5),
                 *(int *)((long)&tab->u + lVar5 + 8));
    }
    iVar2 = JS_SetModuleExport(ctx,m,*(char **)((long)&tab->name + lVar5),obj);
    lVar5 = lVar5 + 0x20;
  } while (iVar2 == 0);
  return -1;
}

Assistant:

int JS_SetModuleExportList(JSContext *ctx, JSModuleDef *m,
                           const JSCFunctionListEntry *tab, int len)
{
    int i;
    JSValue val;

    for(i = 0; i < len; i++) {
        const JSCFunctionListEntry *e = &tab[i];
        switch(e->def_type) {
        case JS_DEF_CFUNC:
            val = JS_NewCFunction2(ctx, e->u.func.cfunc.generic,
                                   e->name, e->u.func.length, e->u.func.cproto, e->magic);
            break;
        case JS_DEF_PROP_STRING:
            val = JS_NewString(ctx, e->u.str);
            break;
        case JS_DEF_PROP_INT32:
            val = JS_NewInt32(ctx, e->u.i32);
            break;
        case JS_DEF_PROP_INT64:
            val = JS_NewInt64(ctx, e->u.i64);
            break;
        case JS_DEF_PROP_DOUBLE:
            val = __JS_NewFloat64(ctx, e->u.f64);
            break;
        case JS_DEF_OBJECT:
            val = JS_NewObject(ctx);
            JS_SetPropertyFunctionList(ctx, val, e->u.prop_list.tab, e->u.prop_list.len);
            break;
        default:
            abort();
        }
        if (JS_SetModuleExport(ctx, m, e->name, val))
            return -1;
    }
    return 0;
}